

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lspdf.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_13;
  ostringstream error_message_12;
  ostringstream error_message_11;
  double signal;
  ostringstream error_message_10;
  Buffer buffer;
  LineSpectralPairsDigitalFilter filter;
  ostringstream error_message_9;
  InputSourcePreprocessingForFilterGain preprocessing;
  InputSourceInterpolation interpolation;
  InputSourceFromStream input_source;
  vector<double,_std::allocator<double>_> filter_coefficients;
  int filter_length;
  FilterGainType gain_type;
  istream *stream_for_filter_input;
  ostringstream error_message_8;
  ifstream ifs2;
  istream *stream_for_filter_coefficients;
  ostringstream error_message_7;
  ifstream ifs1;
  ostringstream error_message_6;
  ostringstream error_message_5;
  int num_input_files;
  char *filter_input_file;
  char *filter_coefficients_file;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int tmp;
  int max;
  int min;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  LocalGainType local_gain_type;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  option *in_stack_ffffffffffffe0f8;
  InputSourceInterpolation *in_stack_ffffffffffffe100;
  int in_stack_ffffffffffffe108;
  undefined4 in_stack_ffffffffffffe10c;
  InputSourceFromStream *in_stack_ffffffffffffe110;
  undefined4 in_stack_ffffffffffffe118;
  FilterGainType in_stack_ffffffffffffe11c;
  InputSourcePreprocessingForFilterGain *in_stack_ffffffffffffe120;
  allocator *paVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe140;
  undefined7 in_stack_ffffffffffffe148;
  InputSourceInterface *source;
  int iVar6;
  char *pcVar7;
  undefined7 in_stack_ffffffffffffe170;
  byte local_1dca;
  bool local_1d9a;
  bool local_1d72;
  bool local_1d42;
  allocator<char> local_1d21;
  string local_1d20 [8];
  ostringstream *in_stack_ffffffffffffe2e8;
  string *in_stack_ffffffffffffe2f0;
  ostringstream local_1d00 [383];
  undefined1 local_1b81 [33];
  ostringstream local_1b60 [383];
  allocator local_19e1;
  string local_19e0 [32];
  ostringstream local_19c0 [391];
  allocator local_1839;
  string local_1838 [32];
  ostringstream local_1818 [456];
  LineSpectralPairsDigitalFilter local_1650;
  allocator local_1639;
  string local_1638 [32];
  ostringstream local_1618 [376];
  InputSourcePreprocessingForFilterGain local_14a0 [6];
  InputSourceInterface local_13d9 [3];
  int local_13c0;
  undefined4 local_13bc;
  char *local_13b8;
  allocator local_13a9;
  string local_13a8 [32];
  ostringstream local_1388 [376];
  char local_1210 [520];
  char *local_1008;
  undefined4 local_1000;
  allocator local_ff9;
  string local_ff8 [32];
  ostringstream local_fd8 [376];
  char local_e60 [527];
  allocator local_c51;
  string local_c50 [32];
  ostringstream local_c30 [383];
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [380];
  int local_914;
  char *local_910;
  char *local_908;
  allocator local_8f9;
  string local_8f8 [32];
  ostringstream local_8d8 [383];
  allocator local_759;
  string local_758 [32];
  ostringstream local_738 [383];
  allocator local_5b9;
  string local_5b8 [32];
  int local_598;
  undefined4 local_594;
  undefined4 local_590;
  allocator local_589;
  string local_588 [32];
  ostringstream local_568 [383];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [36];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 100;
  local_1c = 1;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_24 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe110 >> 0x20),
                                   (char **)CONCAT44(in_stack_ffffffffffffe10c,
                                                     in_stack_ffffffffffffe108),
                                   (char *)in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8,
                                   (int *)0x1037e0), pcVar7 = ya_optarg, local_24 != -1) {
    switch(local_24) {
    case 0x68:
      anon_unknown.dwarf_1734::PrintUsage((ostream *)in_stack_ffffffffffffe120);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,pcVar7,&local_3e9);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108),
                         (int *)in_stack_ffffffffffffe100);
      local_1d9a = !bVar1 || local_1c < 0;
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      if (local_1d9a) {
        std::__cxx11::ostringstream::ostringstream(local_568);
        poVar4 = std::operator<<((ostream *)local_568,"The argument for the -i option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_588,"lspdf",&local_589);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_588);
        std::allocator<char>::~allocator((allocator<char> *)&local_589);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_568);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1734::PrintUsage((ostream *)in_stack_ffffffffffffe120);
      return 1;
    case 0x6b:
      local_590 = 0;
      local_594 = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,pcVar7,&local_5b9);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108),
                         (int *)in_stack_ffffffffffffe100);
      local_1dca = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_598,0,2);
        local_1dca = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      if ((local_1dca & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_738);
        poVar4 = std::operator<<((ostream *)local_738,
                                 "The argument for the -k option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_758,"lspdf",&local_759);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_758);
        std::allocator<char>::~allocator((allocator<char> *)&local_759);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_738);
        return local_4;
      }
      local_20 = local_598;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar7,&local_49);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108),
                         (int *)in_stack_ffffffffffffe100);
      local_1d42 = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_1d42) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar4 = std::operator<<((ostream *)local_1d8,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"lspdf",&local_1f9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar7,&local_221);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108),
                         (int *)in_stack_ffffffffffffe100);
      local_1d72 = !bVar1 || local_18 < 1;
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if (local_1d72) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        std::operator<<((ostream *)local_3a0,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"lspdf",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
    }
  }
  if (local_18 / 2 < local_1c) {
    std::__cxx11::ostringstream::ostringstream(local_8d8);
    poVar4 = std::operator<<((ostream *)local_8d8,
                             "Interpolation period must be equal to or less than half ");
    std::operator<<(poVar4,"frame period");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f8,"lspdf",&local_8f9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
    std::__cxx11::string::~string(local_8f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8d8);
    return local_4;
  }
  local_914 = local_8 - ya_optind;
  if (local_914 == 2) {
    local_908 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_910 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_914 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_a90);
      std::operator<<((ostream *)local_a90,"Just two input files, wfile and infile, are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab0,"lspdf",&local_ab1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a90);
      return local_4;
    }
    local_908 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_910 = (char *)0x0;
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c30);
    std::operator<<((ostream *)local_c30,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c50,"lspdf",&local_c51);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
    std::__cxx11::string::~string(local_c50);
    std::allocator<char>::~allocator((allocator<char> *)&local_c51);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c30);
    return local_4;
  }
  std::ifstream::ifstream(local_e60);
  pcVar7 = local_908;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_e60,(_Ios_Openmode)pcVar7);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_fd8);
    poVar4 = std::operator<<((ostream *)local_fd8,"Cannot open file ");
    std::operator<<(poVar4,local_908);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ff8,"lspdf",&local_ff9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
    std::__cxx11::string::~string(local_ff8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
    local_4 = 1;
    local_1000 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fd8);
    goto LAB_001053a7;
  }
  local_1008 = local_e60;
  std::ifstream::ifstream(local_1210);
  pcVar7 = local_910;
  if (local_910 == (char *)0x0) {
LAB_00104a15:
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      pcVar7 = (char *)&std::cin;
    }
    else {
      pcVar7 = local_1210;
    }
    local_13b8 = pcVar7;
    if (local_20 == 0) {
      local_13bc = 0;
    }
    else if (local_20 == 1) {
      local_13bc = 1;
    }
    else {
      if (local_20 != 2) {
        local_4 = 1;
        local_1000 = 1;
        goto LAB_00105389;
      }
      local_13bc = 3;
    }
    local_13c0 = local_14 + 1;
    source = local_13d9;
    iVar6 = local_20;
    std::allocator<double>::allocator((allocator<double> *)0x104af4);
    uVar3 = (undefined1)((uint)iVar6 >> 0x18);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe120,
               CONCAT44(in_stack_ffffffffffffe11c,in_stack_ffffffffffffe118),
               (allocator_type *)in_stack_ffffffffffffe110);
    std::allocator<double>::~allocator((allocator<double> *)0x104b1a);
    sptk::InputSourceFromStream::InputSourceFromStream
              (in_stack_ffffffffffffe110,SUB41((uint)in_stack_ffffffffffffe10c >> 0x18,0),
               in_stack_ffffffffffffe108,(istream *)in_stack_ffffffffffffe100);
    sptk::InputSourceInterpolation::InputSourceInterpolation
              ((InputSourceInterpolation *)CONCAT17(bVar2,in_stack_ffffffffffffe170),
               (int)((ulong)pcVar7 >> 0x20),(int)pcVar7,(bool)uVar3,source);
    sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
              (in_stack_ffffffffffffe120,in_stack_ffffffffffffe11c,
               &in_stack_ffffffffffffe110->super_InputSourceInterface);
    uVar3 = sptk::InputSourcePreprocessingForFilterGain::IsValid(local_14a0);
    if ((bool)uVar3) {
      sptk::LineSpectralPairsDigitalFilter::LineSpectralPairsDigitalFilter(&local_1650,local_14);
      sptk::LineSpectralPairsDigitalFilter::Buffer::Buffer((Buffer *)in_stack_ffffffffffffe100);
      bVar1 = sptk::LineSpectralPairsDigitalFilter::IsValid(&local_1650);
      if (bVar1) {
        do {
          bVar1 = sptk::ReadStream<double>
                            ((double *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108)
                             ,(istream *)in_stack_ffffffffffffe100);
          if (!bVar1) {
            local_4 = 0;
            local_1000 = 1;
            goto LAB_001052e5;
          }
          bVar1 = sptk::InputSourcePreprocessingForFilterGain::Get
                            ((InputSourcePreprocessingForFilterGain *)
                             CONCAT17(uVar3,in_stack_ffffffffffffe148),in_stack_ffffffffffffe140);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream(local_19c0);
            std::operator<<((ostream *)local_19c0,"Cannot get filter coefficients");
            paVar5 = &local_19e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_19e0,"lspdf",paVar5);
            sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
            std::__cxx11::string::~string(local_19e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_19e1);
            local_4 = 1;
            local_1000 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_19c0);
            goto LAB_001052e5;
          }
          bVar1 = sptk::LineSpectralPairsDigitalFilter::Run
                            ((LineSpectralPairsDigitalFilter *)
                             CONCAT44(in_stack_ffffffffffffe11c,in_stack_ffffffffffffe118),
                             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe110,
                             (double *)CONCAT44(in_stack_ffffffffffffe10c,in_stack_ffffffffffffe108)
                             ,(Buffer *)in_stack_ffffffffffffe100);
          in_stack_ffffffffffffe11c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe11c);
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream(local_1b60);
            std::operator<<((ostream *)local_1b60,
                            "Failed to apply line spectral pairs digital filter");
            in_stack_ffffffffffffe110 = (InputSourceFromStream *)local_1b81;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_1b81 + 1),"lspdf",(allocator *)in_stack_ffffffffffffe110);
            sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
            std::__cxx11::string::~string((string *)(local_1b81 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_1b81);
            local_4 = 1;
            local_1000 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1b60);
            goto LAB_001052e5;
          }
          bVar1 = sptk::WriteStream<double>((double)in_stack_ffffffffffffe0f8,(ostream *)0x1051a2);
          in_stack_ffffffffffffe10c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe10c);
        } while (bVar1);
        std::__cxx11::ostringstream::ostringstream(local_1d00);
        std::operator<<((ostream *)local_1d00,"Failed to write a filter output");
        in_stack_ffffffffffffe100 = (InputSourceInterpolation *)&local_1d21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d20,"lspdf",(allocator *)in_stack_ffffffffffffe100);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_1d20);
        std::allocator<char>::~allocator(&local_1d21);
        local_4 = 1;
        local_1000 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1818);
        std::operator<<((ostream *)local_1818,"Failed to initialize LineSpectralPairsDigitalFilter")
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1838,"lspdf",&local_1839);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
        std::__cxx11::string::~string(local_1838);
        std::allocator<char>::~allocator((allocator<char> *)&local_1839);
        local_4 = 1;
        local_1000 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1818);
      }
LAB_001052e5:
      sptk::LineSpectralPairsDigitalFilter::Buffer::~Buffer((Buffer *)in_stack_ffffffffffffe100);
      sptk::LineSpectralPairsDigitalFilter::~LineSpectralPairsDigitalFilter(&local_1650);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1618);
      std::operator<<((ostream *)local_1618,"Failed to initialize InputSource");
      paVar5 = &local_1639;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1638,"lspdf",paVar5);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
      std::__cxx11::string::~string(local_1638);
      std::allocator<char>::~allocator((allocator<char> *)&local_1639);
      local_4 = 1;
      local_1000 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1618);
    }
    sptk::InputSourcePreprocessingForFilterGain::~InputSourcePreprocessingForFilterGain
              ((InputSourcePreprocessingForFilterGain *)0x10532a);
    sptk::InputSourceInterpolation::~InputSourceInterpolation(in_stack_ffffffffffffe100);
    sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x105344);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe110);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1210,(_Ios_Openmode)pcVar7);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) goto LAB_00104a15;
    std::__cxx11::ostringstream::ostringstream(local_1388);
    poVar4 = std::operator<<((ostream *)local_1388,"Cannot open file ");
    std::operator<<(poVar4,local_910);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_13a8,"lspdf",&local_13a9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe2f0,in_stack_ffffffffffffe2e8);
    std::__cxx11::string::~string(local_13a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
    local_4 = 1;
    local_1000 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1388);
  }
LAB_00105389:
  std::ifstream::~ifstream(local_1210);
LAB_001053a7:
  std::ifstream::~ifstream(local_e60);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  LocalGainType local_gain_type(kDefaultGainType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:k:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        const int min(0);
        const int max(static_cast<int>(kNumGainTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lspdf", error_message);
          return 1;
        }
        local_gain_type = static_cast<LocalGainType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, wfile and infile, are required";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type;
  switch (local_gain_type) {
    case kLinear: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLinear;
      break;
    }
    case kLog: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kLog;
      break;
    }
    case kUnity: {
      gain_type = sptk::InputSourcePreprocessingForFilterGain::kUnity;
      break;
    }
    default: {
      return 1;
    }
  }

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  sptk::LineSpectralPairsDigitalFilter filter(num_filter_order);
  sptk::LineSpectralPairsDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LineSpectralPairsDigitalFilter";
    sptk::PrintErrorMessage("lspdf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply line spectral pairs digital filter";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("lspdf", error_message);
      return 1;
    }
  }

  return 0;
}